

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvr.c
# Opt level: O3

int cvrMain(int argc,char **argv)

{
  char **ppcVar1;
  int iVar2;
  err_t eVar3;
  err_t code;
  int iVar4;
  bool_t bVar5;
  octet *buf;
  octet *privkey;
  char *pcVar6;
  octet *poVar7;
  size_t *date;
  char *sig_name;
  ulong uVar8;
  cmd_sig_t *pcVar9;
  err_t eVar10;
  octet *poVar11;
  size_t cert_len;
  size_t ring_len;
  size_t cert_len_1;
  size_t sig_len;
  size_t ring_len_1;
  size_t sig_len_2;
  size_t offset;
  cmd_pwd_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  octet local_36 [6];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  cvr init -pass <schema> <privkeya> <certa> <ring>\n    init <ring> on behalf of the holder of <privkeya>/<certa>\n  cvr add -pass <schema> <privkeya> <certa> <cert> <ring>\n    add <cert> to <ring>\n  cvr del -pass <schema> <privkeya> <certa> <cert> <ring>\n    remove <cert> from <ring>\n  cvr val <certa> <ring>\n    validate <ring> using <certa> as an anchor\n  cvr find <ring> <cert>\n    find <cert> in <ring>\n  cvr extr -cert<nnn> <ring> <obj_file>\n    extract object from <ring> and store it in <obj_file>\n      -cert<nnn> -- <nnn>th certificate\n        \\remark certificates are numbered from zero\n      -certa -- holder\'s certificate\n  cvr print [-certc] <ring>\n    print <ring> info: all fields or a specific field\n      -certc -- number of certificates\n  .\n"
           ,"cvr","manage certificate rings");
    return -1;
  }
  iVar2 = strCmp(argv[1],"init");
  if (iVar2 == 0) {
    code = cmdStDo(8);
    if (((code == 0) && (code = 0x25b, argc == 7)) && (iVar2 = strCmp(argv[2],"-pass"), iVar2 == 0))
    {
      ppcVar1 = argv + 4;
      code = cmdFileValExist(2,ppcVar1);
      if (code == 0) {
        code = cmdFileValNotExist(1,argv + 6);
        if ((code == 0) && (code = cmdPwdRead(&local_78,argv[3]), code == 0)) {
          local_60 = 0;
          code = cmdPrivkeyRead((octet *)0x0,&local_60,*ppcVar1,local_78);
          if (code != 0) goto LAB_0010a6d7;
          privkey = (octet *)blobCreate(local_60);
          if (privkey == (octet *)0x0) goto LAB_0010ab0f;
          code = cmdPrivkeyRead(privkey,(size_t *)0x0,*ppcVar1,local_78);
          cmdPwdClose(local_78);
          if ((code == 0) && (code = cmdFileWrite(argv[6],(void *)0x0,0), code == 0)) {
            bVar5 = tmDate2((octet *)&local_70);
            if (bVar5 == 0) {
LAB_0010ac06:
              blobClose(privkey);
              code = 0x68;
              goto LAB_0010a8e0;
            }
            pcVar6 = argv[5];
            sig_name = argv[6];
            date = &local_70;
LAB_0010a2f5:
            code = cmdSigSign(sig_name,sig_name,pcVar6,(octet *)date,privkey,local_60);
          }
          goto LAB_0010a8b5;
        }
      }
    }
  }
  else {
    iVar2 = strCmp(argv[1],"add");
    if (iVar2 == 0) {
      code = cmdStDo(8);
      if (((code == 0) && (code = 0x25b, argc == 8)) &&
         (iVar2 = strCmp(argv[2],"-pass"), iVar2 == 0)) {
        ppcVar1 = argv + 4;
        code = cmdFileValExist(4,ppcVar1);
        if ((code == 0) && (code = cmdPwdRead(&local_78,argv[3]), code == 0)) {
          local_60 = 0;
          code = cmdPrivkeyRead((octet *)0x0,&local_60,*ppcVar1,local_78);
          if ((code == 0) &&
             ((code = cmdFileReadAll((void *)0x0,&local_70,argv[5]), code == 0 &&
              (code = cmdFileReadAll((void *)0x0,&local_68,argv[6]), code == 0)))) {
            privkey = (octet *)blobCreate(local_68 + local_60 + local_70 + 0x758);
            if (privkey == (octet *)0x0) {
LAB_0010ab0f:
              cmdPwdClose(local_78);
              goto LAB_0010ab18;
            }
            poVar7 = privkey + local_60;
            poVar11 = poVar7 + local_70;
            local_48 = local_68;
            code = cmdPrivkeyRead(privkey,(size_t *)0x0,*ppcVar1,local_78);
            cmdPwdClose(local_78);
            if (((code == 0) && (code = cmdFileReadAll(poVar7,&local_70,argv[5]), code == 0)) &&
               (code = btokCVCMatch(poVar7,local_70,privkey,local_60), code == 0)) {
              pcVar9 = (cmd_sig_t *)(poVar11 + local_48);
              code = cmdSigRead(pcVar9,&local_50,argv[7]);
              if (code == 0) {
                if ((pcVar9->certs_len != local_70) ||
                   (bVar5 = memEq(pcVar9->certs,poVar7,pcVar9->certs_len), bVar5 == 0)) {
LAB_0010ab76:
                  blobClose(privkey);
                  code = 0x203;
                  goto LAB_0010a8e0;
                }
                code = cmdSigVerify2(argv[7],argv[7],poVar7,local_70);
                if (((code == 0) &&
                    ((code = cmdFileReadAll(poVar11,&local_68,argv[6]), code == 0 &&
                     (code = btokCVCUnwrap((btok_cvc_t *)(poVar11 + local_48 + 0x630),poVar11,
                                           local_68,(octet *)0x0,0), code == 0)))) &&
                   (code = cmdFileReadAll((void *)0x0,&local_58,argv[7]), code == 0)) {
                  poVar7 = (octet *)blobCreate(local_58);
                  if (poVar7 == (octet *)0x0) {
LAB_0010ac20:
                    blobClose(privkey);
                    goto LAB_0010ab18;
                  }
                  code = cmdFileReadAll(poVar7,&local_58,argv[7]);
                  if (code == 0) {
                    eVar3 = cmdCVCsFind((size_t *)0x0,poVar7,local_58 - local_50,poVar11,local_68);
                    eVar10 = 0;
                    if (eVar3 != 0x70) {
                      eVar10 = eVar3;
                    }
                    code = 0x71;
                    if (eVar3 != 0) {
                      code = eVar10;
                    }
                    if (code == 0) {
                      buf = poVar7;
                      if ((local_68 <= local_58) ||
                         (buf = (octet *)blobResize(poVar7,(local_58 + local_68) - local_50),
                         buf != (octet *)0x0)) {
                        memCopy(buf + (local_58 - local_50),poVar11,local_68);
                        code = cmdFileWrite(argv[7],buf,(local_58 - local_50) + local_68);
                        blobClose(buf);
                        if (code == 0) {
                          bVar5 = tmDate2((octet *)&local_40);
                          if (bVar5 == 0) goto LAB_0010ac06;
                          pcVar6 = argv[5];
                          sig_name = argv[7];
                          date = &local_40;
                          goto LAB_0010a2f5;
                        }
                        goto LAB_0010a8b5;
                      }
                      blobClose(poVar7);
                      goto LAB_0010ac20;
                    }
                  }
LAB_0010ab62:
                  blobClose(poVar7);
                }
              }
            }
LAB_0010a8b5:
            blobClose(privkey);
          }
          else {
LAB_0010a6d7:
            cmdPwdClose(local_78);
          }
        }
      }
    }
    else {
      iVar2 = strCmp(argv[1],"del");
      if (iVar2 == 0) {
        code = cmdStDo(8);
        if (((code == 0) && (code = 0x25b, argc == 8)) &&
           (iVar2 = strCmp(argv[2],"-pass"), iVar2 == 0)) {
          ppcVar1 = argv + 4;
          code = cmdFileValExist(4,ppcVar1);
          if ((code == 0) && (code = cmdPwdRead(&local_78,argv[3]), code == 0)) {
            local_60 = 0;
            code = cmdPrivkeyRead((octet *)0x0,&local_60,*ppcVar1,local_78);
            if ((code != 0) ||
               ((code = cmdFileReadAll((void *)0x0,&local_70,argv[5]), code != 0 ||
                (code = cmdFileReadAll((void *)0x0,&local_68,argv[6]), code != 0))))
            goto LAB_0010a6d7;
            privkey = (octet *)blobCreate(local_68 + local_60 + local_70 + 0x758);
            if (privkey == (octet *)0x0) goto LAB_0010ab0f;
            poVar7 = privkey + local_60;
            poVar11 = poVar7 + local_70;
            local_48 = local_68;
            code = cmdPrivkeyRead(privkey,(size_t *)0x0,*ppcVar1,local_78);
            cmdPwdClose(local_78);
            if (((code == 0) && (code = cmdFileReadAll(poVar7,&local_70,argv[5]), code == 0)) &&
               (code = btokCVCMatch(poVar7,local_70,privkey,local_60), code == 0)) {
              pcVar9 = (cmd_sig_t *)(poVar11 + local_48);
              code = cmdSigRead(pcVar9,&local_50,argv[7]);
              if (code == 0) {
                if ((pcVar9->certs_len != local_70) ||
                   (bVar5 = memEq(pcVar9->certs,poVar7,pcVar9->certs_len), bVar5 == 0))
                goto LAB_0010ab76;
                code = cmdSigVerify2(argv[7],argv[7],poVar7,local_70);
                if (((code == 0) && (code = cmdFileReadAll(poVar11,&local_68,argv[6]), code == 0))
                   && ((code = btokCVCUnwrap((btok_cvc_t *)(poVar11 + local_48 + 0x630),poVar11,
                                             local_68,(octet *)0x0,0), code == 0 &&
                       (code = cmdFileReadAll((void *)0x0,&local_58,argv[7]), code == 0)))) {
                  poVar7 = (octet *)blobCreate(local_58);
                  if (poVar7 == (octet *)0x0) goto LAB_0010ac20;
                  code = cmdFileReadAll(poVar7,&local_58,argv[7]);
                  if ((code != 0) ||
                     (code = cmdCVCsFind(&local_40,poVar7,local_58 - local_50,poVar11,local_68),
                     code != 0)) goto LAB_0010ab62;
                  memMove(poVar7 + local_40,poVar7 + local_40 + local_68,
                          local_58 - (local_68 + local_40 + local_50));
                  code = cmdFileWrite(argv[7],poVar7,local_58 - (local_50 + local_68));
                  blobClose(poVar7);
                  if (code == 0) {
                    bVar5 = tmDate2(local_36);
                    if (bVar5 == 0) goto LAB_0010ac06;
                    pcVar6 = argv[5];
                    sig_name = argv[7];
                    date = (size_t *)local_36;
                    goto LAB_0010a2f5;
                  }
                }
              }
            }
            goto LAB_0010a8b5;
          }
        }
      }
      else {
        iVar2 = strCmp(argv[1],"val");
        if (iVar2 == 0) {
          code = cmdStDo(8);
          if ((code == 0) && (code = 0x25b, argc == 4)) {
            ppcVar1 = argv + 2;
            code = cmdFileValExist(2,ppcVar1);
            if ((code == 0) &&
               (code = cmdFileReadAll((void *)0x0,(size_t *)&local_78,*ppcVar1), code == 0)) {
              privkey = (octet *)blobCreate((size_t)(local_78 + 0x630));
              if (privkey != (octet *)0x0) {
                pcVar9 = (cmd_sig_t *)(local_78 + (long)privkey);
                code = cmdFileReadAll(privkey,(size_t *)&local_78,*ppcVar1);
                if ((code == 0) && (code = cmdSigRead(pcVar9,&local_60,argv[3]), code == 0)) {
                  if ((cmd_pwd_t)pcVar9->certs_len == local_78) {
                    memEq(pcVar9->certs,privkey,pcVar9->certs_len);
                  }
                  code = cmdSigVerify2(argv[3],argv[3],privkey,(size_t)local_78);
                  if ((code == 0) &&
                     (code = cmdFileReadAll((void *)0x0,&local_70,argv[3]), code == 0)) {
                    poVar7 = (octet *)blobCreate(local_70);
                    if (poVar7 != (octet *)0x0) {
                      code = cmdFileReadAll(poVar7,&local_70,argv[3]);
                      if (code == 0) {
                        code = cmdCVCsCheck(poVar7,local_70 - local_60);
                      }
                      goto LAB_0010ab62;
                    }
                    code = 0x6e;
                  }
                }
                goto LAB_0010a8b5;
              }
LAB_0010ab18:
              code = 0x6e;
            }
          }
        }
        else {
          iVar2 = strCmp(argv[1],"find");
          if (iVar2 == 0) {
            code = 0x25b;
            if (argc == 4) {
              ppcVar1 = argv + 2;
              code = cmdFileValExist(2,ppcVar1);
              if (((code == 0) &&
                  (code = cmdFileReadAll((void *)0x0,(size_t *)&local_78,argv[3]), code == 0)) &&
                 (code = cmdFileReadAll((void *)0x0,&local_70,*ppcVar1), code == 0)) {
                uVar8 = 0x630;
                if (0x630 < local_70) {
                  uVar8 = local_70;
                }
                privkey = (octet *)blobCreate((size_t)(local_78 + uVar8));
                if (privkey == (octet *)0x0) goto LAB_0010ab18;
                pcVar9 = (cmd_sig_t *)(local_78 + (long)privkey);
                code = cmdFileReadAll(privkey,(size_t *)&local_78,argv[3]);
                if (((code == 0) && (code = cmdSigRead(pcVar9,&local_60,*ppcVar1), code == 0)) &&
                   (code = cmdFileReadAll(pcVar9,&local_70,*ppcVar1), code == 0)) {
                  code = cmdCVCsFind((size_t *)0x0,(octet *)pcVar9,local_70 - local_60,privkey,
                                     (size_t)local_78);
                }
                goto LAB_0010a8b5;
              }
            }
          }
          else {
            iVar2 = strCmp(argv[1],"extr");
            if (iVar2 == 0) {
              code = cvrExtr(argc + -2,argv + 2);
            }
            else {
              iVar2 = strCmp(argv[1],"print");
              if (iVar2 != 0) {
                code = 0x259;
                iVar2 = -1;
                goto LAB_0010a8ea;
              }
              code = cvrPrint(argc + -2,argv + 2);
            }
          }
        }
      }
    }
  }
LAB_0010a8e0:
  iVar2 = -1;
  if (code == 0) {
    iVar2 = strCmp(argv[1],"val");
    if (iVar2 == 0) {
      iVar2 = 0;
      code = 0;
    }
    else {
      iVar4 = strCmp(argv[1],"find");
      iVar2 = 0;
      code = 0;
      if (iVar4 != 0) {
        return 0;
      }
    }
  }
LAB_0010a8ea:
  pcVar6 = errMsg(code);
  printf("bee2cmd/%s: %s\n","cvr",pcVar6);
  return iVar2;
}

Assistant:

int cvrMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return cvrUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "init"))
		code = cvrCreate(argc - 1, argv + 1);
	else if (strEq(argv[0], "add"))
		code = cvrAdd(argc - 1, argv + 1);
	else if (strEq(argv[0], "del"))
		code = cvrDel(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = cvrVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "find"))
		code = cvrFind(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = cvrExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = cvrPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val") || strEq(argv[0], "find"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}